

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLimiter.cpp
# Opt level: O0

int main(void)

{
  AssertionException *e;
  
  TestAllRequestsBelowMaxAreAccepted(100000);
  TestAllRequestsAboveMaxAreDeclined(100000);
  TestWithPeakLoadAtStart_SingleIteration(100000);
  TestWithAdjacentPeaks(100000);
  TestWithEvenLoad(100000);
  std::operator<<((ostream *)&std::cout,"All Tests passed successfully\n");
  system("pause");
  return 0;
}

Assistant:

int main()
{
    // Failing tests are commented out.
    try
    {
        TestAllRequestsBelowMaxAreAccepted(LimiterSpecs::maxRPS);
        TestAllRequestsAboveMaxAreDeclined(LimiterSpecs::maxRPS);
        TestWithPeakLoadAtStart_SingleIteration(LimiterSpecs::maxRPS);
        //TestWithPeakLoadAtStart_MultipleIterations(LimiterSpecs::maxRPS, 10);
        TestWithAdjacentPeaks(LimiterSpecs::maxRPS);
        TestWithEvenLoad(LimiterSpecs::maxRPS);
        std::cout << "All Tests passed successfully\n";
    }
    catch (AssertionException& e)
    {
        std::cout << "One or more of tests failed: " << e.what() << '\n';
    }
    system("pause");
    return 0;
}